

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

RuleBasedCollator * __thiscall
icu_63::RuleBasedNumberFormat::getCollator(RuleBasedNumberFormat *this)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  RuleBasedCollator *this_00;
  RuleBasedCollator *local_b8;
  RuleBasedCollator *local_a8;
  undefined1 local_70 [8];
  UnicodeString rules;
  RuleBasedCollator *newCollator;
  Collator *temp;
  RuleBasedNumberFormat *pRStack_18;
  UErrorCode status;
  RuleBasedNumberFormat *this_local;
  
  if (this->fRuleSets == (NFRuleSet **)0x0) {
    this_local = (RuleBasedNumberFormat *)0x0;
  }
  else {
    if ((this->collator == (RuleBasedCollator *)0x0) && (this->lenient != '\0')) {
      temp._4_4_ = U_ZERO_ERROR;
      pRStack_18 = this;
      newCollator = (RuleBasedCollator *)
                    Collator::createInstance(&this->locale,(UErrorCode *)((long)&temp + 4));
      UVar1 = ::U_SUCCESS(temp._4_4_);
      if (UVar1 != '\0') {
        if (newCollator == (RuleBasedCollator *)0x0) {
          local_a8 = (RuleBasedCollator *)0x0;
        }
        else {
          local_a8 = (RuleBasedCollator *)
                     __dynamic_cast(newCollator,&Collator::typeinfo,&RuleBasedCollator::typeinfo,0);
        }
        rules.fUnion._48_8_ = local_a8;
        if (local_a8 != (RuleBasedCollator *)0x0) {
          if (this->lenientParseRules == (UnicodeString *)0x0) {
            newCollator = (RuleBasedCollator *)0x0;
          }
          else {
            pUVar2 = RuleBasedCollator::getRules(local_a8);
            UnicodeString::UnicodeString((UnicodeString *)local_70,pUVar2);
            pUVar2 = this->lenientParseRules;
            UnicodeString::append((UnicodeString *)local_70,pUVar2);
            this_00 = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)pUVar2);
            local_b8 = (RuleBasedCollator *)0x0;
            if (this_00 != (RuleBasedCollator *)0x0) {
              RuleBasedCollator::RuleBasedCollator
                        (this_00,(UnicodeString *)local_70,(UErrorCode *)((long)&temp + 4));
              local_b8 = this_00;
            }
            rules.fUnion._48_8_ = local_b8;
            if (local_b8 == (RuleBasedCollator *)0x0) {
              this_local = (RuleBasedNumberFormat *)0x0;
            }
            UnicodeString::~UnicodeString((UnicodeString *)local_70);
            if (local_b8 == (RuleBasedCollator *)0x0) {
              return (RuleBasedCollator *)this_local;
            }
          }
          UVar1 = ::U_SUCCESS(temp._4_4_);
          if (UVar1 == '\0') {
            if (rules.fUnion._48_8_ != 0) {
              (**(code **)(*(long *)rules.fUnion._48_8_ + 8))();
            }
          }
          else {
            (**(code **)(*(long *)rules.fUnion._48_8_ + 0xb8))
                      (rules.fUnion._48_8_,4,0x11,(long)&temp + 4);
            this->collator = (RuleBasedCollator *)rules.fUnion._48_8_;
          }
        }
      }
      if (newCollator != (RuleBasedCollator *)0x0) {
        (*(newCollator->super_Collator).super_UObject._vptr_UObject[1])();
      }
    }
    this_local = (RuleBasedNumberFormat *)this->collator;
  }
  return (RuleBasedCollator *)this_local;
}

Assistant:

const RuleBasedCollator*
RuleBasedNumberFormat::getCollator() const
{
#if !UCONFIG_NO_COLLATION
    if (!fRuleSets) {
        return NULL;
    }

    // lazy-evaluate the collator
    if (collator == NULL && lenient) {
        // create a default collator based on the formatter's locale,
        // then pull out that collator's rules, append any additional
        // rules specified in the description, and create a _new_
        // collator based on the combination of those rules

        UErrorCode status = U_ZERO_ERROR;

        Collator* temp = Collator::createInstance(locale, status);
        RuleBasedCollator* newCollator;
        if (U_SUCCESS(status) && (newCollator = dynamic_cast<RuleBasedCollator*>(temp)) != NULL) {
            if (lenientParseRules) {
                UnicodeString rules(newCollator->getRules());
                rules.append(*lenientParseRules);

                newCollator = new RuleBasedCollator(rules, status);
                // Exit if newCollator could not be created.
                if (newCollator == NULL) {
                    return NULL;
                }
            } else {
                temp = NULL;
            }
            if (U_SUCCESS(status)) {
                newCollator->setAttribute(UCOL_DECOMPOSITION_MODE, UCOL_ON, status);
                // cast away const
                ((RuleBasedNumberFormat*)this)->collator = newCollator;
            } else {
                delete newCollator;
            }
        }
        delete temp;
    }
#endif

    // if lenient-parse mode is off, this will be null
    // (see setLenientParseMode())
    return collator;
}